

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

int gdImageColorReplaceCallback(gdImagePtr im,gdCallbackImageColor callback)

{
  bool bVar1;
  int color;
  int iVar2;
  ulong uVar3;
  int *src;
  long lVar4;
  int *dst;
  int iVar5;
  uint len;
  int x;
  long lVar6;
  
  if (callback == (gdCallbackImageColor)0x0) {
    iVar2 = 0;
  }
  else if (im->trueColor == 0) {
    src = (int *)gdCalloc((long)im->colorsTotal,4);
    if (src == (int *)0x0) {
      iVar2 = -1;
    }
    else {
      iVar2 = im->colorsTotal;
      if (iVar2 < 1) {
        len = 0;
      }
      else {
        lVar4 = 0;
        len = 0;
        do {
          if (im->open[lVar4] == 0) {
            lVar6 = (long)(int)len;
            len = len + 1;
            src[lVar6] = (int)lVar4;
            iVar2 = im->colorsTotal;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar2);
      }
      dst = (int *)gdCalloc((long)(int)len,4);
      if (dst == (int *)0x0) {
        iVar2 = -1;
      }
      else {
        if ((int)len < 1) {
          len = 0;
        }
        else {
          uVar3 = 0;
          do {
            iVar2 = (*callback)(im,src[uVar3]);
            dst[uVar3] = iVar2;
            uVar3 = uVar3 + 1;
          } while (len != uVar3);
        }
        iVar2 = gdImageColorReplaceArray(im,len,src,dst);
        gdFree(dst);
      }
      gdFree(src);
    }
  }
  else {
    iVar2 = 0;
    iVar5 = im->cy2;
    if (im->cy1 <= iVar5) {
      uVar3 = (ulong)(uint)im->cx2;
      iVar2 = 0;
      lVar4 = (long)im->cy1;
      do {
        x = im->cx1;
        if (x <= (int)uVar3) {
          lVar6 = (long)x + -1;
          do {
            iVar5 = im->tpixels[lVar4][lVar6 + 1];
            color = (*callback)(im,iVar5);
            if (color != iVar5) {
              gdImageSetPixel(im,x,(int)lVar4,color);
              iVar2 = iVar2 + 1;
            }
            uVar3 = (ulong)im->cx2;
            lVar6 = lVar6 + 1;
            x = x + 1;
          } while (lVar6 < (long)uVar3);
          iVar5 = im->cy2;
        }
        bVar1 = lVar4 < iVar5;
        lVar4 = lVar4 + 1;
      } while (bVar1);
    }
  }
  return iVar2;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceCallback (gdImagePtr im, gdCallbackImageColor callback)
{
	int c, d, n = 0;

	if (!callback) {
		return 0;
	}
	if (im->trueColor) {
		register int x, y;

		for (y = im->cy1; y <= im->cy2; y++) {
			for (x = im->cx1; x <= im->cx2; x++) {
				c = gdImageTrueColorPixel(im, x, y);
				if ( (d = callback(im, c)) != c) {
					gdImageSetPixel(im, x, y, d);
					n++;
				}
			}
		}
	} else { /* palette */
		int *sarr, *darr;
		int k, len = 0;

		sarr = (int *)gdCalloc(im->colorsTotal, sizeof(int));
		if (!sarr) {
			return -1;
		}
		for (c = 0; c < im->colorsTotal; c++) {
			if (!im->open[c]) {
				sarr[len++] = c;
			}
		}
		darr = (int *)gdCalloc(len, sizeof(int));
		if (!darr) {
			gdFree(sarr);
			return -1;
		}
		for (k = 0; k < len; k++) {
			darr[k] = callback(im, sarr[k]);
		}
		n = gdImageColorReplaceArray(im, k, sarr, darr);
		gdFree(darr);
		gdFree(sarr);
	}
	return n;
}